

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

undefined8 gimage::anon_unknown_17::getTileName(string *prefix,int trow,int tcol,string *suffix)

{
  ostream *poVar1;
  int in_ECX;
  int in_EDX;
  string *in_RSI;
  undefined8 in_RDI;
  string *in_R8;
  ostringstream ret;
  long local_198 [47];
  string *local_20;
  int local_18;
  int local_14;
  string *local_10;
  
  local_20 = in_R8;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::fill((char)local_198 + (char)*(undefined8 *)(local_198[0] + -0x18));
  std::ostream::operator<<(local_198,std::right);
  poVar1 = std::operator<<((ostream *)local_198,local_10);
  std::operator<<(poVar1,'_');
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),2);
  std::ostream::operator<<(local_198,local_14);
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),0);
  std::operator<<((ostream *)local_198,'_');
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),2);
  std::ostream::operator<<(local_198,local_18);
  std::ios_base::width((ios_base *)((long)local_198 + *(long *)(local_198[0] + -0x18)),0);
  poVar1 = std::operator<<((ostream *)local_198,'_');
  std::operator<<(poVar1,local_20);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return in_RDI;
}

Assistant:

std::string getTileName(const std::string &prefix, int trow, int tcol, const std::string &suffix)
{
  std::ostringstream ret;

  ret.fill('0');
  ret << std::right;

  ret << prefix << '_';

  ret.width(2);
  ret << trow;
  ret.width(0);
  ret << '_';
  ret.width(2);
  ret << tcol;
  ret.width(0);

  ret << '_' << suffix;

  return ret.str();
}